

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

void __thiscall
FCompileContext::CheckReturn(FCompileContext *this,PPrototype *proto,FScriptPosition *pos)

{
  uint uVar1;
  undefined8 in_RAX;
  PPrototype *pPVar2;
  uint uVar3;
  PPrototype *pPVar4;
  ulong uVar5;
  
  if (proto == (PPrototype *)0x0) {
    __assert_fail("proto != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x7b,"void FCompileContext::CheckReturn(PPrototype *, FScriptPosition &)");
  }
  pPVar4 = this->ReturnProto;
  if (pPVar4 == (PPrototype *)0x0) {
    this->ReturnProto = proto;
  }
  else {
    uVar1 = (pPVar4->ReturnTypes).Count;
    uVar3 = (proto->ReturnTypes).Count;
    pPVar2 = proto;
    if (uVar1 < uVar3) {
      this->ReturnProto = proto;
      pPVar2 = pPVar4;
      pPVar4 = proto;
      uVar3 = uVar1;
    }
    if (uVar3 == 0) {
      if ((pPVar4->ReturnTypes).Count != 0) {
LAB_0068d194:
        FScriptPosition::Message(pos,2,"All return expressions must deduce to the same type",in_RAX)
        ;
        return;
      }
    }
    else {
      uVar5 = 0;
      do {
        if ((pPVar4->ReturnTypes).Array[uVar5] != (pPVar2->ReturnTypes).Array[uVar5])
        goto LAB_0068d194;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  return;
}

Assistant:

void FCompileContext::CheckReturn(PPrototype *proto, FScriptPosition &pos)
{
	assert(proto != nullptr);
	bool fail = false;

	if (ReturnProto == nullptr)
	{
		ReturnProto = proto;
		return;
	}

	// A prototype that defines fewer return types can be compatible with
	// one that defines more if the shorter one matches the initial types
	// for the longer one.
	if (ReturnProto->ReturnTypes.Size() < proto->ReturnTypes.Size())
	{ // Make proto the shorter one to avoid code duplication below.
		swapvalues(proto, ReturnProto);
	}
	// If one prototype returns nothing, they both must.
	if (proto->ReturnTypes.Size() == 0)
	{
		if (ReturnProto->ReturnTypes.Size() != 0)
		{
			fail = true;
		}
	}
	else
	{
		for (unsigned i = 0; i < proto->ReturnTypes.Size(); i++)
		{
			if (ReturnProto->ReturnTypes[i] != proto->ReturnTypes[i])
			{ // Incompatible
				fail = true;
				break;
			}
		}
	}

	if (fail)
	{
		pos.Message(MSG_ERROR, "All return expressions must deduce to the same type");
	}
}